

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void __thiscall tinyxml2::XMLDocument::PrintError(XMLDocument *this)

{
  char buf2 [20];
  char buf1 [20];
  char local_48 [32];
  char local_28 [32];
  
  if (this->_errorID != XML_NO_ERROR) {
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0] = '\0';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    if (this->_errorStr1 != (char *)0x0) {
      snprintf(local_28,0x14,"%s");
    }
    if (this->_errorStr2 != (char *)0x0) {
      snprintf(local_48,0x14,"%s");
    }
    printf("XMLDocument error id=%d \'%s\' str1=%s str2=%s\n",(ulong)this->_errorID,
           *(undefined8 *)(_errorNames + (ulong)this->_errorID * 8),local_28,local_48);
  }
  return;
}

Assistant:

bool Error() const {
        return _errorID != XML_NO_ERROR;
    }